

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_true,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::QuadMvIntersectorKPluecker<4,_8,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  long lVar1;
  undefined4 uVar2;
  Scene *pSVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  ulong uVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 (*pauVar34) [16];
  int iVar35;
  uint uVar36;
  uint uVar37;
  long lVar38;
  long lVar39;
  ulong uVar40;
  ulong uVar41;
  long lVar42;
  ulong uVar43;
  ulong uVar44;
  undefined1 (*pauVar45) [16];
  undefined4 uVar46;
  ulong unaff_R12;
  ulong uVar47;
  ulong uVar48;
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [64];
  undefined1 auVar53 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar54 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  float fVar85;
  float fVar86;
  undefined1 auVar82 [16];
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [64];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [64];
  undefined1 auVar97 [32];
  undefined1 auVar98 [64];
  float fVar99;
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  undefined1 auVar103 [64];
  float fVar110;
  float fVar112;
  float fVar113;
  float fVar114;
  undefined1 auVar111 [32];
  float fVar115;
  float fVar118;
  float fVar119;
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  float fVar121;
  float fVar122;
  undefined1 auVar120 [32];
  float fVar123;
  float fVar125;
  float fVar126;
  float fVar127;
  undefined1 auVar124 [32];
  float fVar128;
  float fVar130;
  float fVar131;
  float fVar132;
  undefined1 auVar129 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  RTCFilterFunctionNArguments local_15f0;
  undefined1 local_15c0 [32];
  undefined1 local_15a0 [32];
  undefined1 local_1580 [32];
  undefined1 local_1560 [32];
  undefined1 local_1540 [32];
  undefined1 local_1510 [16];
  undefined1 local_1500 [32];
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  float local_14b0;
  float fStack_14ac;
  float fStack_14a8;
  float fStack_14a4;
  float local_14a0;
  float fStack_149c;
  float fStack_1498;
  float fStack_1494;
  float local_1490;
  float fStack_148c;
  float fStack_1488;
  float fStack_1484;
  float local_1480;
  float fStack_147c;
  float fStack_1478;
  float fStack_1474;
  float local_1470;
  float fStack_146c;
  float fStack_1468;
  float fStack_1464;
  float local_1460;
  float fStack_145c;
  float fStack_1458;
  float fStack_1454;
  undefined1 local_1450 [16];
  undefined1 local_1440 [16];
  undefined1 local_1430 [16];
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined1 local_1400 [16];
  undefined4 uStack_13f0;
  undefined4 uStack_13ec;
  undefined4 uStack_13e8;
  undefined4 uStack_13e4;
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  float local_12c0 [4];
  float fStack_12b0;
  float fStack_12ac;
  float fStack_12a8;
  undefined4 uStack_12a4;
  float local_12a0 [4];
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  undefined4 uStack_1284;
  float local_1280 [4];
  float fStack_1270;
  float fStack_126c;
  float fStack_1268;
  undefined4 uStack_1264;
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [8];
  float fStack_1218;
  float fStack_1214;
  float fStack_1210;
  float fStack_120c;
  float fStack_1208;
  undefined4 uStack_1204;
  undefined1 local_1200 [32];
  undefined1 local_11e0 [32];
  undefined1 local_11c0 [32];
  undefined1 local_11a0 [32];
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  float local_1140;
  float fStack_113c;
  float fStack_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  float fStack_1128;
  float fStack_1124;
  undefined1 local_1120 [32];
  undefined1 local_1100 [32];
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  RTCHitN local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined4 local_1060;
  undefined4 uStack_105c;
  undefined4 uStack_1058;
  undefined4 uStack_1054;
  undefined4 uStack_1050;
  undefined4 uStack_104c;
  undefined4 uStack_1048;
  undefined4 uStack_1044;
  undefined4 local_1040;
  undefined4 uStack_103c;
  undefined4 uStack_1038;
  undefined4 uStack_1034;
  undefined4 uStack_1030;
  undefined4 uStack_102c;
  undefined4 uStack_1028;
  undefined4 uStack_1024;
  undefined4 local_1020;
  undefined4 uStack_101c;
  undefined4 uStack_1018;
  undefined4 uStack_1014;
  undefined4 uStack_1010;
  undefined4 uStack_100c;
  undefined4 uStack_1008;
  undefined4 uStack_1004;
  undefined1 local_1000 [32];
  uint local_fe0;
  uint uStack_fdc;
  uint uStack_fd8;
  uint uStack_fd4;
  uint uStack_fd0;
  uint uStack_fcc;
  uint uStack_fc8;
  uint uStack_fc4;
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  
  pauVar45 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  uVar46 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_1430._4_4_ = uVar46;
  local_1430._0_4_ = uVar46;
  local_1430._8_4_ = uVar46;
  local_1430._12_4_ = uVar46;
  auVar96 = ZEXT1664(local_1430);
  uVar46 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1440._4_4_ = uVar46;
  local_1440._0_4_ = uVar46;
  local_1440._8_4_ = uVar46;
  local_1440._12_4_ = uVar46;
  auVar98 = ZEXT1664(local_1440);
  uVar46 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_1450._4_4_ = uVar46;
  local_1450._0_4_ = uVar46;
  local_1450._8_4_ = uVar46;
  local_1450._12_4_ = uVar46;
  auVar103 = ZEXT1664(local_1450);
  local_1490 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_14a0 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_14b0 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  local_1460 = local_1490 * 0.99999964;
  local_1470 = local_14a0 * 0.99999964;
  local_1480 = local_14b0 * 0.99999964;
  local_1490 = local_1490 * 1.0000004;
  local_14a0 = local_14a0 * 1.0000004;
  local_14b0 = local_14b0 * 1.0000004;
  uVar40 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar43 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar44 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  iVar35 = (tray->tnear).field_0.i[k];
  local_1510._4_4_ = iVar35;
  local_1510._0_4_ = iVar35;
  local_1510._8_4_ = iVar35;
  local_1510._12_4_ = iVar35;
  auVar92 = ZEXT1664(local_1510);
  iVar35 = (tray->tfar).field_0.i[k];
  auVar52 = ZEXT1664(CONCAT412(iVar35,CONCAT48(iVar35,CONCAT44(iVar35,iVar35))));
  local_1200._16_16_ = mm_lookupmask_ps._240_16_;
  local_1200._0_16_ = mm_lookupmask_ps._0_16_;
  iVar35 = 1 << ((uint)k & 0x1f);
  auVar55._4_4_ = iVar35;
  auVar55._0_4_ = iVar35;
  auVar55._8_4_ = iVar35;
  auVar55._12_4_ = iVar35;
  auVar55._16_4_ = iVar35;
  auVar55._20_4_ = iVar35;
  auVar55._24_4_ = iVar35;
  auVar55._28_4_ = iVar35;
  auVar56 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar55 = vpand_avx2(auVar55,auVar56);
  local_1240 = vpcmpeqd_avx2(auVar55,auVar56);
  auVar62._8_4_ = 0x3f800000;
  auVar62._0_8_ = &DAT_3f8000003f800000;
  auVar62._12_4_ = 0x3f800000;
  auVar62._16_4_ = 0x3f800000;
  auVar62._20_4_ = 0x3f800000;
  auVar62._24_4_ = 0x3f800000;
  auVar62._28_4_ = 0x3f800000;
  auVar56._8_4_ = 0xbf800000;
  auVar56._0_8_ = 0xbf800000bf800000;
  auVar56._12_4_ = 0xbf800000;
  auVar56._16_4_ = 0xbf800000;
  auVar56._20_4_ = 0xbf800000;
  auVar56._24_4_ = 0xbf800000;
  auVar56._28_4_ = 0xbf800000;
  _local_1220 = vblendvps_avx(auVar62,auVar56,local_1200);
  fVar110 = local_1460;
  fVar112 = local_1460;
  fVar113 = local_1460;
  fVar114 = local_1460;
  fVar115 = local_1470;
  fVar118 = local_1470;
  fVar119 = local_1470;
  fVar99 = local_1470;
  fVar85 = local_1480;
  fVar86 = local_1480;
  fVar87 = local_1480;
  fVar88 = local_1480;
  fVar89 = local_1490;
  fVar90 = local_1490;
  fVar121 = local_1490;
  fVar122 = local_1490;
  fVar123 = local_14a0;
  fVar125 = local_14a0;
  fVar126 = local_14a0;
  fVar127 = local_14a0;
  fVar128 = local_14b0;
  fVar130 = local_14b0;
  fVar131 = local_14b0;
  fVar132 = local_14b0;
  fStack_14ac = local_14b0;
  fStack_14a8 = local_14b0;
  fStack_14a4 = local_14b0;
  fStack_149c = local_14a0;
  fStack_1498 = local_14a0;
  fStack_1494 = local_14a0;
  fStack_148c = local_1490;
  fStack_1488 = local_1490;
  fStack_1484 = local_1490;
  fStack_147c = local_1480;
  fStack_1478 = local_1480;
  fStack_1474 = local_1480;
  fStack_146c = local_1470;
  fStack_1468 = local_1470;
  fStack_1464 = local_1470;
  fStack_145c = local_1460;
  fStack_1458 = local_1460;
  fStack_1454 = local_1460;
  do {
    do {
      do {
        if (pauVar45 == (undefined1 (*) [16])&local_fa0) {
          return;
        }
        pauVar34 = pauVar45 + -1;
        pauVar45 = pauVar45 + -1;
      } while (*(float *)(ray + k * 4 + 0x100) < *(float *)(*pauVar34 + 8));
      uVar48 = *(ulong *)*pauVar45;
      do {
        if ((uVar48 & 8) == 0) {
          auVar54 = vsubps_avx(*(undefined1 (*) [16])(uVar48 + 0x20 + uVar40),auVar96._0_16_);
          auVar53._0_4_ = fVar110 * auVar54._0_4_;
          auVar53._4_4_ = fVar112 * auVar54._4_4_;
          auVar53._8_4_ = fVar113 * auVar54._8_4_;
          auVar53._12_4_ = fVar114 * auVar54._12_4_;
          auVar54 = vsubps_avx(*(undefined1 (*) [16])(uVar48 + 0x20 + uVar43),auVar98._0_16_);
          auVar65._0_4_ = fVar115 * auVar54._0_4_;
          auVar65._4_4_ = fVar118 * auVar54._4_4_;
          auVar65._8_4_ = fVar119 * auVar54._8_4_;
          auVar65._12_4_ = fVar99 * auVar54._12_4_;
          auVar54 = vmaxps_avx(auVar53,auVar65);
          auVar53 = vsubps_avx(*(undefined1 (*) [16])(uVar48 + 0x20 + uVar44),auVar103._0_16_);
          auVar66._0_4_ = fVar85 * auVar53._0_4_;
          auVar66._4_4_ = fVar86 * auVar53._4_4_;
          auVar66._8_4_ = fVar87 * auVar53._8_4_;
          auVar66._12_4_ = fVar88 * auVar53._12_4_;
          auVar53 = vmaxps_avx(auVar66,auVar92._0_16_);
          local_1400 = vmaxps_avx(auVar54,auVar53);
          auVar54 = vsubps_avx(*(undefined1 (*) [16])(uVar48 + 0x20 + (uVar40 ^ 0x10)),
                               auVar96._0_16_);
          auVar67._0_4_ = fVar89 * auVar54._0_4_;
          auVar67._4_4_ = fVar90 * auVar54._4_4_;
          auVar67._8_4_ = fVar121 * auVar54._8_4_;
          auVar67._12_4_ = fVar122 * auVar54._12_4_;
          auVar54 = vsubps_avx(*(undefined1 (*) [16])(uVar48 + 0x20 + (uVar43 ^ 0x10)),
                               auVar98._0_16_);
          auVar71._0_4_ = fVar123 * auVar54._0_4_;
          auVar71._4_4_ = fVar125 * auVar54._4_4_;
          auVar71._8_4_ = fVar126 * auVar54._8_4_;
          auVar71._12_4_ = fVar127 * auVar54._12_4_;
          auVar54 = vminps_avx(auVar67,auVar71);
          auVar53 = vsubps_avx(*(undefined1 (*) [16])(uVar48 + 0x20 + (uVar44 ^ 0x10)),
                               auVar103._0_16_);
          auVar72._0_4_ = fVar128 * auVar53._0_4_;
          auVar72._4_4_ = fVar130 * auVar53._4_4_;
          auVar72._8_4_ = fVar131 * auVar53._8_4_;
          auVar72._12_4_ = fVar132 * auVar53._12_4_;
          auVar53 = vminps_avx(auVar72,auVar52._0_16_);
          auVar54 = vminps_avx(auVar54,auVar53);
          auVar54 = vcmpps_avx(local_1400,auVar54,2);
          uVar46 = vmovmskps_avx(auVar54);
          unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),uVar46);
        }
        if ((uVar48 & 8) == 0) {
          if (unaff_R12 == 0) {
            iVar35 = 4;
          }
          else {
            uVar47 = uVar48 & 0xfffffffffffffff0;
            lVar39 = 0;
            for (uVar48 = unaff_R12; (uVar48 & 1) == 0; uVar48 = uVar48 >> 1 | 0x8000000000000000) {
              lVar39 = lVar39 + 1;
            }
            iVar35 = 0;
            uVar41 = unaff_R12 - 1 & unaff_R12;
            uVar48 = *(ulong *)(uVar47 + lVar39 * 8);
            if (uVar41 != 0) {
              uVar37 = *(uint *)(local_1400 + lVar39 * 4);
              lVar39 = 0;
              for (uVar14 = uVar41; (uVar14 & 1) == 0; uVar14 = uVar14 >> 1 | 0x8000000000000000) {
                lVar39 = lVar39 + 1;
              }
              uVar41 = uVar41 - 1 & uVar41;
              uVar14 = *(ulong *)(uVar47 + lVar39 * 8);
              uVar36 = *(uint *)(local_1400 + lVar39 * 4);
              if (uVar41 == 0) {
                if (uVar37 < uVar36) {
                  *(ulong *)*pauVar45 = uVar14;
                  *(uint *)(*pauVar45 + 8) = uVar36;
                  pauVar45 = pauVar45 + 1;
                }
                else {
                  *(ulong *)*pauVar45 = uVar48;
                  *(uint *)(*pauVar45 + 8) = uVar37;
                  pauVar45 = pauVar45 + 1;
                  uVar48 = uVar14;
                }
              }
              else {
                auVar54._8_8_ = 0;
                auVar54._0_8_ = uVar48;
                auVar54 = vpunpcklqdq_avx(auVar54,ZEXT416(uVar37));
                auVar68._8_8_ = 0;
                auVar68._0_8_ = uVar14;
                auVar53 = vpunpcklqdq_avx(auVar68,ZEXT416(uVar36));
                lVar39 = 0;
                for (uVar48 = uVar41; (uVar48 & 1) == 0; uVar48 = uVar48 >> 1 | 0x8000000000000000)
                {
                  lVar39 = lVar39 + 1;
                }
                uVar41 = uVar41 - 1 & uVar41;
                auVar73._8_8_ = 0;
                auVar73._0_8_ = *(ulong *)(uVar47 + lVar39 * 8);
                auVar66 = vpunpcklqdq_avx(auVar73,ZEXT416(*(uint *)(local_1400 + lVar39 * 4)));
                auVar65 = vpcmpgtd_avx(auVar53,auVar54);
                if (uVar41 == 0) {
                  auVar67 = vpshufd_avx(auVar65,0xaa);
                  auVar65 = vblendvps_avx(auVar53,auVar54,auVar67);
                  auVar54 = vblendvps_avx(auVar54,auVar53,auVar67);
                  auVar53 = vpcmpgtd_avx(auVar66,auVar65);
                  auVar67 = vpshufd_avx(auVar53,0xaa);
                  auVar53 = vblendvps_avx(auVar66,auVar65,auVar67);
                  auVar65 = vblendvps_avx(auVar65,auVar66,auVar67);
                  auVar66 = vpcmpgtd_avx(auVar65,auVar54);
                  auVar67 = vpshufd_avx(auVar66,0xaa);
                  auVar66 = vblendvps_avx(auVar65,auVar54,auVar67);
                  auVar54 = vblendvps_avx(auVar54,auVar65,auVar67);
                  *pauVar45 = auVar54;
                  pauVar45[1] = auVar66;
                  uVar48 = auVar53._0_8_;
                  pauVar45 = pauVar45 + 2;
                }
                else {
                  lVar39 = 0;
                  for (; (uVar41 & 1) == 0; uVar41 = uVar41 >> 1 | 0x8000000000000000) {
                    lVar39 = lVar39 + 1;
                  }
                  auVar82._8_8_ = 0;
                  auVar82._0_8_ = *(ulong *)(uVar47 + lVar39 * 8);
                  auVar71 = vpunpcklqdq_avx(auVar82,ZEXT416(*(uint *)(local_1400 + lVar39 * 4)));
                  auVar67 = vpshufd_avx(auVar65,0xaa);
                  auVar65 = vblendvps_avx(auVar53,auVar54,auVar67);
                  auVar54 = vblendvps_avx(auVar54,auVar53,auVar67);
                  auVar53 = vpcmpgtd_avx(auVar71,auVar66);
                  auVar67 = vpshufd_avx(auVar53,0xaa);
                  auVar53 = vblendvps_avx(auVar71,auVar66,auVar67);
                  auVar66 = vblendvps_avx(auVar66,auVar71,auVar67);
                  auVar67 = vpcmpgtd_avx(auVar66,auVar54);
                  auVar71 = vpshufd_avx(auVar67,0xaa);
                  auVar67 = vblendvps_avx(auVar66,auVar54,auVar71);
                  auVar54 = vblendvps_avx(auVar54,auVar66,auVar71);
                  auVar66 = vpcmpgtd_avx(auVar53,auVar65);
                  auVar71 = vpshufd_avx(auVar66,0xaa);
                  auVar66 = vblendvps_avx(auVar53,auVar65,auVar71);
                  auVar53 = vblendvps_avx(auVar65,auVar53,auVar71);
                  auVar65 = vpcmpgtd_avx(auVar67,auVar53);
                  auVar71 = vpshufd_avx(auVar65,0xaa);
                  auVar65 = vblendvps_avx(auVar67,auVar53,auVar71);
                  auVar53 = vblendvps_avx(auVar53,auVar67,auVar71);
                  *pauVar45 = auVar54;
                  pauVar45[1] = auVar53;
                  pauVar45[2] = auVar65;
                  auVar92 = ZEXT1664(local_1510);
                  uVar48 = auVar66._0_8_;
                  pauVar45 = pauVar45 + 3;
                }
              }
            }
          }
        }
        else {
          iVar35 = 6;
        }
      } while (iVar35 == 0);
    } while (iVar35 != 6);
    lVar39 = (ulong)((uint)uVar48 & 0xf) - 8;
    if (lVar39 != 0) {
      uVar48 = uVar48 & 0xfffffffffffffff0;
      lVar42 = 0;
      do {
        lVar38 = lVar42 * 0xe0;
        lVar1 = uVar48 + 0xd0 + lVar38;
        local_1420 = *(undefined8 *)(lVar1 + 0x10);
        uStack_1418 = *(undefined8 *)(lVar1 + 0x18);
        lVar1 = uVar48 + 0xc0 + lVar38;
        local_10e0 = *(undefined8 *)(lVar1 + 0x10);
        uStack_10d8 = *(undefined8 *)(lVar1 + 0x18);
        uStack_10d0 = local_10e0;
        uStack_10c8 = uStack_10d8;
        uStack_1410 = local_1420;
        uStack_1408 = uStack_1418;
        auVar74._16_16_ = *(undefined1 (*) [16])(uVar48 + 0x60 + lVar38);
        auVar74._0_16_ = *(undefined1 (*) [16])(uVar48 + lVar38);
        auVar57._16_16_ = *(undefined1 (*) [16])(uVar48 + 0x70 + lVar38);
        auVar57._0_16_ = *(undefined1 (*) [16])(uVar48 + 0x10 + lVar38);
        auVar69._16_16_ = *(undefined1 (*) [16])(uVar48 + 0x80 + lVar38);
        auVar69._0_16_ = *(undefined1 (*) [16])(uVar48 + 0x20 + lVar38);
        auVar54 = *(undefined1 (*) [16])(uVar48 + 0x30 + lVar38);
        auVar91._16_16_ = auVar54;
        auVar91._0_16_ = auVar54;
        auVar54 = *(undefined1 (*) [16])(uVar48 + 0x40 + lVar38);
        auVar77._16_16_ = auVar54;
        auVar77._0_16_ = auVar54;
        auVar54 = *(undefined1 (*) [16])(uVar48 + 0x50 + lVar38);
        auVar83._16_16_ = auVar54;
        auVar83._0_16_ = auVar54;
        auVar54 = *(undefined1 (*) [16])(uVar48 + 0x90 + lVar38);
        auVar93._16_16_ = auVar54;
        auVar93._0_16_ = auVar54;
        auVar54 = *(undefined1 (*) [16])(uVar48 + 0xa0 + lVar38);
        auVar129._16_16_ = auVar54;
        auVar129._0_16_ = auVar54;
        auVar54 = *(undefined1 (*) [16])(uVar48 + 0xb0 + lVar38);
        auVar49._16_16_ = auVar54;
        auVar49._0_16_ = auVar54;
        uVar46 = *(undefined4 *)(ray + k * 4);
        auVar116._4_4_ = uVar46;
        auVar116._0_4_ = uVar46;
        auVar116._8_4_ = uVar46;
        auVar116._12_4_ = uVar46;
        auVar116._16_4_ = uVar46;
        auVar116._20_4_ = uVar46;
        auVar116._24_4_ = uVar46;
        auVar116._28_4_ = uVar46;
        uVar46 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar120._4_4_ = uVar46;
        auVar120._0_4_ = uVar46;
        auVar120._8_4_ = uVar46;
        auVar120._12_4_ = uVar46;
        auVar120._16_4_ = uVar46;
        auVar120._20_4_ = uVar46;
        auVar120._24_4_ = uVar46;
        auVar120._28_4_ = uVar46;
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar124._4_4_ = uVar2;
        auVar124._0_4_ = uVar2;
        auVar124._8_4_ = uVar2;
        auVar124._12_4_ = uVar2;
        auVar124._16_4_ = uVar2;
        auVar124._20_4_ = uVar2;
        auVar124._24_4_ = uVar2;
        auVar124._28_4_ = uVar2;
        local_1560 = vsubps_avx(auVar74,auVar116);
        local_1580 = vsubps_avx(auVar57,auVar120);
        auVar55 = vsubps_avx(auVar69,auVar124);
        auVar56 = vsubps_avx(auVar91,auVar116);
        auVar62 = vsubps_avx(auVar77,auVar120);
        auVar11 = vsubps_avx(auVar83,auVar124);
        auVar57 = vsubps_avx(auVar93,auVar116);
        auVar69 = vsubps_avx(auVar129,auVar120);
        auVar12 = vsubps_avx(auVar49,auVar124);
        local_15c0 = vsubps_avx(auVar57,local_1560);
        local_1100 = vsubps_avx(auVar69,local_1580);
        local_1500 = vsubps_avx(auVar12,auVar55);
        auVar50._0_4_ = local_1560._0_4_ + auVar57._0_4_;
        auVar50._4_4_ = local_1560._4_4_ + auVar57._4_4_;
        auVar50._8_4_ = local_1560._8_4_ + auVar57._8_4_;
        auVar50._12_4_ = local_1560._12_4_ + auVar57._12_4_;
        auVar50._16_4_ = local_1560._16_4_ + auVar57._16_4_;
        auVar50._20_4_ = local_1560._20_4_ + auVar57._20_4_;
        auVar50._24_4_ = local_1560._24_4_ + auVar57._24_4_;
        auVar50._28_4_ = local_1560._28_4_ + auVar57._28_4_;
        auVar94._0_4_ = auVar69._0_4_ + local_1580._0_4_;
        auVar94._4_4_ = auVar69._4_4_ + local_1580._4_4_;
        auVar94._8_4_ = auVar69._8_4_ + local_1580._8_4_;
        auVar94._12_4_ = auVar69._12_4_ + local_1580._12_4_;
        auVar94._16_4_ = auVar69._16_4_ + local_1580._16_4_;
        auVar94._20_4_ = auVar69._20_4_ + local_1580._20_4_;
        auVar94._24_4_ = auVar69._24_4_ + local_1580._24_4_;
        auVar94._28_4_ = auVar69._28_4_ + local_1580._28_4_;
        fVar110 = auVar55._0_4_;
        auVar78._0_4_ = auVar12._0_4_ + fVar110;
        fVar112 = auVar55._4_4_;
        auVar78._4_4_ = auVar12._4_4_ + fVar112;
        fVar113 = auVar55._8_4_;
        auVar78._8_4_ = auVar12._8_4_ + fVar113;
        fVar114 = auVar55._12_4_;
        auVar78._12_4_ = auVar12._12_4_ + fVar114;
        fVar115 = auVar55._16_4_;
        auVar78._16_4_ = auVar12._16_4_ + fVar115;
        fVar118 = auVar55._20_4_;
        auVar78._20_4_ = auVar12._20_4_ + fVar118;
        fVar119 = auVar55._24_4_;
        auVar78._24_4_ = auVar12._24_4_ + fVar119;
        fVar104 = auVar12._28_4_;
        auVar78._28_4_ = fVar104 + auVar55._28_4_;
        auVar13._4_4_ = local_1500._4_4_ * auVar94._4_4_;
        auVar13._0_4_ = local_1500._0_4_ * auVar94._0_4_;
        auVar13._8_4_ = local_1500._8_4_ * auVar94._8_4_;
        auVar13._12_4_ = local_1500._12_4_ * auVar94._12_4_;
        auVar13._16_4_ = local_1500._16_4_ * auVar94._16_4_;
        auVar13._20_4_ = local_1500._20_4_ * auVar94._20_4_;
        auVar13._24_4_ = local_1500._24_4_ * auVar94._24_4_;
        auVar13._28_4_ = uVar46;
        auVar53 = vfmsub231ps_fma(auVar13,local_1100,auVar78);
        auVar15._4_4_ = local_15c0._4_4_ * auVar78._4_4_;
        auVar15._0_4_ = local_15c0._0_4_ * auVar78._0_4_;
        auVar15._8_4_ = local_15c0._8_4_ * auVar78._8_4_;
        auVar15._12_4_ = local_15c0._12_4_ * auVar78._12_4_;
        auVar15._16_4_ = local_15c0._16_4_ * auVar78._16_4_;
        auVar15._20_4_ = local_15c0._20_4_ * auVar78._20_4_;
        auVar15._24_4_ = local_15c0._24_4_ * auVar78._24_4_;
        auVar15._28_4_ = auVar78._28_4_;
        auVar54 = vfmsub231ps_fma(auVar15,local_1500,auVar50);
        auVar16._4_4_ = local_1100._4_4_ * auVar50._4_4_;
        auVar16._0_4_ = local_1100._0_4_ * auVar50._0_4_;
        auVar16._8_4_ = local_1100._8_4_ * auVar50._8_4_;
        auVar16._12_4_ = local_1100._12_4_ * auVar50._12_4_;
        auVar16._16_4_ = local_1100._16_4_ * auVar50._16_4_;
        auVar16._20_4_ = local_1100._20_4_ * auVar50._20_4_;
        auVar16._24_4_ = local_1100._24_4_ * auVar50._24_4_;
        auVar16._28_4_ = auVar50._28_4_;
        auVar65 = vfmsub231ps_fma(auVar16,local_15c0,auVar94);
        uVar46 = *(undefined4 *)(ray + k * 4 + 0xa0);
        auVar117._4_4_ = uVar46;
        auVar117._0_4_ = uVar46;
        auVar117._8_4_ = uVar46;
        auVar117._12_4_ = uVar46;
        auVar117._16_4_ = uVar46;
        auVar117._20_4_ = uVar46;
        auVar117._24_4_ = uVar46;
        auVar117._28_4_ = uVar46;
        local_1140 = *(float *)(ray + k * 4 + 0xc0);
        auVar17._4_4_ = local_1140 * auVar65._4_4_;
        auVar17._0_4_ = local_1140 * auVar65._0_4_;
        auVar17._8_4_ = local_1140 * auVar65._8_4_;
        auVar17._12_4_ = local_1140 * auVar65._12_4_;
        auVar17._16_4_ = local_1140 * 0.0;
        auVar17._20_4_ = local_1140 * 0.0;
        auVar17._24_4_ = local_1140 * 0.0;
        auVar17._28_4_ = fVar104;
        auVar54 = vfmadd231ps_fma(auVar17,auVar117,ZEXT1632(auVar54));
        uVar46 = *(undefined4 *)(ray + k * 4 + 0x80);
        local_1120._4_4_ = uVar46;
        local_1120._0_4_ = uVar46;
        local_1120._8_4_ = uVar46;
        local_1120._12_4_ = uVar46;
        local_1120._16_4_ = uVar46;
        local_1120._20_4_ = uVar46;
        local_1120._24_4_ = uVar46;
        local_1120._28_4_ = uVar46;
        local_1400 = vfmadd231ps_fma(ZEXT1632(auVar54),local_1120,ZEXT1632(auVar53));
        local_1160 = vsubps_avx(local_1580,auVar62);
        local_1180 = vsubps_avx(auVar55,auVar11);
        auVar58._0_4_ = auVar62._0_4_ + local_1580._0_4_;
        auVar58._4_4_ = auVar62._4_4_ + local_1580._4_4_;
        auVar58._8_4_ = auVar62._8_4_ + local_1580._8_4_;
        auVar58._12_4_ = auVar62._12_4_ + local_1580._12_4_;
        auVar58._16_4_ = auVar62._16_4_ + local_1580._16_4_;
        auVar58._20_4_ = auVar62._20_4_ + local_1580._20_4_;
        auVar58._24_4_ = auVar62._24_4_ + local_1580._24_4_;
        auVar58._28_4_ = auVar62._28_4_ + local_1580._28_4_;
        auVar79._0_4_ = fVar110 + auVar11._0_4_;
        auVar79._4_4_ = fVar112 + auVar11._4_4_;
        auVar79._8_4_ = fVar113 + auVar11._8_4_;
        auVar79._12_4_ = fVar114 + auVar11._12_4_;
        auVar79._16_4_ = fVar115 + auVar11._16_4_;
        auVar79._20_4_ = fVar118 + auVar11._20_4_;
        auVar79._24_4_ = fVar119 + auVar11._24_4_;
        fVar99 = auVar11._28_4_;
        auVar79._28_4_ = auVar55._28_4_ + fVar99;
        fVar85 = local_1180._0_4_;
        fVar88 = local_1180._4_4_;
        auVar18._4_4_ = auVar58._4_4_ * fVar88;
        auVar18._0_4_ = auVar58._0_4_ * fVar85;
        fVar121 = local_1180._8_4_;
        auVar18._8_4_ = auVar58._8_4_ * fVar121;
        fVar125 = local_1180._12_4_;
        auVar18._12_4_ = auVar58._12_4_ * fVar125;
        fVar128 = local_1180._16_4_;
        auVar18._16_4_ = auVar58._16_4_ * fVar128;
        fVar132 = local_1180._20_4_;
        auVar18._20_4_ = auVar58._20_4_ * fVar132;
        fVar8 = local_1180._24_4_;
        auVar18._24_4_ = auVar58._24_4_ * fVar8;
        auVar18._28_4_ = auVar94._28_4_;
        auVar53 = vfmsub231ps_fma(auVar18,local_1160,auVar79);
        local_11a0 = vsubps_avx(local_1560,auVar56);
        fVar86 = local_11a0._0_4_;
        fVar89 = local_11a0._4_4_;
        auVar19._4_4_ = auVar79._4_4_ * fVar89;
        auVar19._0_4_ = auVar79._0_4_ * fVar86;
        fVar122 = local_11a0._8_4_;
        auVar19._8_4_ = auVar79._8_4_ * fVar122;
        fVar126 = local_11a0._12_4_;
        auVar19._12_4_ = auVar79._12_4_ * fVar126;
        fVar130 = local_11a0._16_4_;
        auVar19._16_4_ = auVar79._16_4_ * fVar130;
        fVar6 = local_11a0._20_4_;
        auVar19._20_4_ = auVar79._20_4_ * fVar6;
        fVar9 = local_11a0._24_4_;
        auVar19._24_4_ = auVar79._24_4_ * fVar9;
        auVar19._28_4_ = auVar79._28_4_;
        auVar100._0_4_ = local_1560._0_4_ + auVar56._0_4_;
        auVar100._4_4_ = local_1560._4_4_ + auVar56._4_4_;
        auVar100._8_4_ = local_1560._8_4_ + auVar56._8_4_;
        auVar100._12_4_ = local_1560._12_4_ + auVar56._12_4_;
        auVar100._16_4_ = local_1560._16_4_ + auVar56._16_4_;
        auVar100._20_4_ = local_1560._20_4_ + auVar56._20_4_;
        auVar100._24_4_ = local_1560._24_4_ + auVar56._24_4_;
        auVar100._28_4_ = local_1560._28_4_ + auVar56._28_4_;
        auVar54 = vfmsub231ps_fma(auVar19,local_1180,auVar100);
        fVar87 = local_1160._0_4_;
        fVar90 = local_1160._4_4_;
        auVar20._4_4_ = auVar100._4_4_ * fVar90;
        auVar20._0_4_ = auVar100._0_4_ * fVar87;
        fVar123 = local_1160._8_4_;
        auVar20._8_4_ = auVar100._8_4_ * fVar123;
        fVar127 = local_1160._12_4_;
        auVar20._12_4_ = auVar100._12_4_ * fVar127;
        fVar131 = local_1160._16_4_;
        auVar20._16_4_ = auVar100._16_4_ * fVar131;
        fVar7 = local_1160._20_4_;
        auVar20._20_4_ = auVar100._20_4_ * fVar7;
        fVar10 = local_1160._24_4_;
        auVar20._24_4_ = auVar100._24_4_ * fVar10;
        auVar20._28_4_ = auVar100._28_4_;
        auVar65 = vfmsub231ps_fma(auVar20,local_11a0,auVar58);
        auVar101._0_4_ = auVar65._0_4_ * local_1140;
        auVar101._4_4_ = auVar65._4_4_ * local_1140;
        auVar101._8_4_ = auVar65._8_4_ * local_1140;
        auVar101._12_4_ = auVar65._12_4_ * local_1140;
        auVar101._16_4_ = local_1140 * 0.0;
        auVar101._20_4_ = local_1140 * 0.0;
        auVar101._24_4_ = local_1140 * 0.0;
        auVar101._28_4_ = 0;
        auVar54 = vfmadd231ps_fma(auVar101,auVar117,ZEXT1632(auVar54));
        auVar54 = vfmadd231ps_fma(ZEXT1632(auVar54),local_1120,ZEXT1632(auVar53));
        auVar13 = vsubps_avx(auVar56,auVar57);
        auVar75._0_4_ = auVar56._0_4_ + auVar57._0_4_;
        auVar75._4_4_ = auVar56._4_4_ + auVar57._4_4_;
        auVar75._8_4_ = auVar56._8_4_ + auVar57._8_4_;
        auVar75._12_4_ = auVar56._12_4_ + auVar57._12_4_;
        auVar75._16_4_ = auVar56._16_4_ + auVar57._16_4_;
        auVar75._20_4_ = auVar56._20_4_ + auVar57._20_4_;
        auVar75._24_4_ = auVar56._24_4_ + auVar57._24_4_;
        auVar75._28_4_ = auVar56._28_4_ + auVar57._28_4_;
        auVar57 = vsubps_avx(auVar62,auVar69);
        auVar84._0_4_ = auVar62._0_4_ + auVar69._0_4_;
        auVar84._4_4_ = auVar62._4_4_ + auVar69._4_4_;
        auVar84._8_4_ = auVar62._8_4_ + auVar69._8_4_;
        auVar84._12_4_ = auVar62._12_4_ + auVar69._12_4_;
        auVar84._16_4_ = auVar62._16_4_ + auVar69._16_4_;
        auVar84._20_4_ = auVar62._20_4_ + auVar69._20_4_;
        auVar84._24_4_ = auVar62._24_4_ + auVar69._24_4_;
        auVar84._28_4_ = auVar62._28_4_ + auVar69._28_4_;
        auVar69 = vsubps_avx(auVar11,auVar12);
        auVar59._0_4_ = auVar11._0_4_ + auVar12._0_4_;
        auVar59._4_4_ = auVar11._4_4_ + auVar12._4_4_;
        auVar59._8_4_ = auVar11._8_4_ + auVar12._8_4_;
        auVar59._12_4_ = auVar11._12_4_ + auVar12._12_4_;
        auVar59._16_4_ = auVar11._16_4_ + auVar12._16_4_;
        auVar59._20_4_ = auVar11._20_4_ + auVar12._20_4_;
        auVar59._24_4_ = auVar11._24_4_ + auVar12._24_4_;
        auVar59._28_4_ = fVar99 + fVar104;
        auVar11._4_4_ = auVar69._4_4_ * auVar84._4_4_;
        auVar11._0_4_ = auVar69._0_4_ * auVar84._0_4_;
        auVar11._8_4_ = auVar69._8_4_ * auVar84._8_4_;
        auVar11._12_4_ = auVar69._12_4_ * auVar84._12_4_;
        auVar11._16_4_ = auVar69._16_4_ * auVar84._16_4_;
        auVar11._20_4_ = auVar69._20_4_ * auVar84._20_4_;
        auVar11._24_4_ = auVar69._24_4_ * auVar84._24_4_;
        auVar11._28_4_ = fVar99;
        auVar65 = vfmsub231ps_fma(auVar11,auVar57,auVar59);
        auVar12._4_4_ = auVar59._4_4_ * auVar13._4_4_;
        auVar12._0_4_ = auVar59._0_4_ * auVar13._0_4_;
        auVar12._8_4_ = auVar59._8_4_ * auVar13._8_4_;
        auVar12._12_4_ = auVar59._12_4_ * auVar13._12_4_;
        auVar12._16_4_ = auVar59._16_4_ * auVar13._16_4_;
        auVar12._20_4_ = auVar59._20_4_ * auVar13._20_4_;
        auVar12._24_4_ = auVar59._24_4_ * auVar13._24_4_;
        auVar12._28_4_ = auVar59._28_4_;
        auVar53 = vfmsub231ps_fma(auVar12,auVar69,auVar75);
        auVar21._4_4_ = auVar57._4_4_ * auVar75._4_4_;
        auVar21._0_4_ = auVar57._0_4_ * auVar75._0_4_;
        auVar21._8_4_ = auVar57._8_4_ * auVar75._8_4_;
        auVar21._12_4_ = auVar57._12_4_ * auVar75._12_4_;
        auVar21._16_4_ = auVar57._16_4_ * auVar75._16_4_;
        auVar21._20_4_ = auVar57._20_4_ * auVar75._20_4_;
        auVar21._24_4_ = auVar57._24_4_ * auVar75._24_4_;
        auVar21._28_4_ = auVar75._28_4_;
        auVar66 = vfmsub231ps_fma(auVar21,auVar13,auVar84);
        fStack_113c = local_1140;
        fStack_1138 = local_1140;
        fStack_1134 = local_1140;
        fStack_1130 = local_1140;
        fStack_112c = local_1140;
        fStack_1128 = local_1140;
        fStack_1124 = local_1140;
        auVar76._0_4_ = local_1140 * auVar66._0_4_;
        auVar76._4_4_ = local_1140 * auVar66._4_4_;
        auVar76._8_4_ = local_1140 * auVar66._8_4_;
        auVar76._12_4_ = local_1140 * auVar66._12_4_;
        auVar76._16_4_ = local_1140 * 0.0;
        auVar76._20_4_ = local_1140 * 0.0;
        auVar76._24_4_ = local_1140 * 0.0;
        auVar76._28_4_ = 0;
        auVar53 = vfmadd231ps_fma(auVar76,auVar117,ZEXT1632(auVar53));
        auVar53 = vfmadd231ps_fma(ZEXT1632(auVar53),local_1120,ZEXT1632(auVar65));
        local_13e0 = ZEXT1632(auVar54);
        local_13c0 = ZEXT1632(CONCAT412(auVar53._12_4_ + auVar54._12_4_ + local_1400._12_4_,
                                        CONCAT48(auVar53._8_4_ + auVar54._8_4_ + local_1400._8_4_,
                                                 CONCAT44(auVar53._4_4_ +
                                                          auVar54._4_4_ + local_1400._4_4_,
                                                          auVar53._0_4_ +
                                                          auVar54._0_4_ + local_1400._0_4_))));
        auVar60._8_4_ = 0x7fffffff;
        auVar60._0_8_ = 0x7fffffff7fffffff;
        auVar60._12_4_ = 0x7fffffff;
        auVar60._16_4_ = 0x7fffffff;
        auVar60._20_4_ = 0x7fffffff;
        auVar60._24_4_ = 0x7fffffff;
        auVar60._28_4_ = 0x7fffffff;
        auVar55 = vminps_avx(ZEXT1632(local_1400),local_13e0);
        auVar55 = vminps_avx(auVar55,ZEXT1632(auVar53));
        local_11e0 = vandps_avx(local_13c0,auVar60);
        fVar99 = local_11e0._0_4_ * 1.1920929e-07;
        fVar104 = local_11e0._4_4_ * 1.1920929e-07;
        auVar22._4_4_ = fVar104;
        auVar22._0_4_ = fVar99;
        fVar105 = local_11e0._8_4_ * 1.1920929e-07;
        auVar22._8_4_ = fVar105;
        fVar106 = local_11e0._12_4_ * 1.1920929e-07;
        auVar22._12_4_ = fVar106;
        fVar107 = local_11e0._16_4_ * 1.1920929e-07;
        auVar22._16_4_ = fVar107;
        fVar108 = local_11e0._20_4_ * 1.1920929e-07;
        auVar22._20_4_ = fVar108;
        fVar109 = local_11e0._24_4_ * 1.1920929e-07;
        auVar22._24_4_ = fVar109;
        auVar22._28_4_ = 0x34000000;
        auVar95._0_8_ = CONCAT44(fVar104,fVar99) ^ 0x8000000080000000;
        auVar95._8_4_ = -fVar105;
        auVar95._12_4_ = -fVar106;
        auVar95._16_4_ = -fVar107;
        auVar95._20_4_ = -fVar108;
        auVar95._24_4_ = -fVar109;
        auVar95._28_4_ = 0xb4000000;
        auVar55 = vcmpps_avx(auVar55,auVar95,5);
        local_11c0 = ZEXT1632(local_1400);
        auVar62 = vmaxps_avx(ZEXT1632(local_1400),local_13e0);
        auVar56 = vmaxps_avx(auVar62,ZEXT1632(auVar53));
        auVar56 = vcmpps_avx(auVar56,auVar22,2);
        auVar56 = vorps_avx(auVar55,auVar56);
        if ((((((((auVar56 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar56 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar56 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar56 >> 0x7f,0) != '\0') ||
              (auVar56 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar56 >> 0xbf,0) != '\0') ||
            (auVar56 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar56[0x1f] < '\0') {
          auVar23._4_4_ = fVar90 * local_1500._4_4_;
          auVar23._0_4_ = fVar87 * local_1500._0_4_;
          auVar23._8_4_ = fVar123 * local_1500._8_4_;
          auVar23._12_4_ = fVar127 * local_1500._12_4_;
          auVar23._16_4_ = fVar131 * local_1500._16_4_;
          auVar23._20_4_ = fVar7 * local_1500._20_4_;
          auVar23._24_4_ = fVar10 * local_1500._24_4_;
          auVar23._28_4_ = auVar55._28_4_;
          auVar24._4_4_ = fVar89 * local_1100._4_4_;
          auVar24._0_4_ = fVar86 * local_1100._0_4_;
          auVar24._8_4_ = fVar122 * local_1100._8_4_;
          auVar24._12_4_ = fVar126 * local_1100._12_4_;
          auVar24._16_4_ = fVar130 * local_1100._16_4_;
          auVar24._20_4_ = fVar6 * local_1100._20_4_;
          auVar24._24_4_ = fVar9 * local_1100._24_4_;
          auVar24._28_4_ = 0x34000000;
          auVar53 = vfmsub213ps_fma(local_1100,local_1180,auVar23);
          auVar25._4_4_ = auVar57._4_4_ * fVar88;
          auVar25._0_4_ = auVar57._0_4_ * fVar85;
          auVar25._8_4_ = auVar57._8_4_ * fVar121;
          auVar25._12_4_ = auVar57._12_4_ * fVar125;
          auVar25._16_4_ = auVar57._16_4_ * fVar128;
          auVar25._20_4_ = auVar57._20_4_ * fVar132;
          auVar25._24_4_ = auVar57._24_4_ * fVar8;
          auVar25._28_4_ = auVar62._28_4_;
          auVar26._4_4_ = fVar89 * auVar69._4_4_;
          auVar26._0_4_ = fVar86 * auVar69._0_4_;
          auVar26._8_4_ = fVar122 * auVar69._8_4_;
          auVar26._12_4_ = fVar126 * auVar69._12_4_;
          auVar26._16_4_ = fVar130 * auVar69._16_4_;
          auVar26._20_4_ = fVar6 * auVar69._20_4_;
          auVar26._24_4_ = fVar9 * auVar69._24_4_;
          auVar26._28_4_ = local_11e0._28_4_;
          auVar65 = vfmsub213ps_fma(auVar69,local_1160,auVar25);
          auVar55 = vandps_avx(auVar23,auVar60);
          auVar62 = vandps_avx(auVar25,auVar60);
          auVar55 = vcmpps_avx(auVar55,auVar62,1);
          local_13a0 = vblendvps_avx(ZEXT1632(auVar65),ZEXT1632(auVar53),auVar55);
          auVar27._4_4_ = fVar90 * auVar13._4_4_;
          auVar27._0_4_ = fVar87 * auVar13._0_4_;
          auVar27._8_4_ = fVar123 * auVar13._8_4_;
          auVar27._12_4_ = fVar127 * auVar13._12_4_;
          auVar27._16_4_ = fVar131 * auVar13._16_4_;
          auVar27._20_4_ = fVar7 * auVar13._20_4_;
          auVar27._24_4_ = fVar10 * auVar13._24_4_;
          auVar27._28_4_ = auVar55._28_4_;
          auVar53 = vfmsub213ps_fma(auVar13,local_1180,auVar26);
          auVar28._4_4_ = local_15c0._4_4_ * fVar88;
          auVar28._0_4_ = local_15c0._0_4_ * fVar85;
          auVar28._8_4_ = local_15c0._8_4_ * fVar121;
          auVar28._12_4_ = local_15c0._12_4_ * fVar125;
          auVar28._16_4_ = local_15c0._16_4_ * fVar128;
          auVar28._20_4_ = local_15c0._20_4_ * fVar132;
          auVar28._24_4_ = local_15c0._24_4_ * fVar8;
          auVar28._28_4_ = auVar62._28_4_;
          auVar65 = vfmsub213ps_fma(local_1500,local_11a0,auVar28);
          auVar55 = vandps_avx(auVar28,auVar60);
          auVar62 = vandps_avx(auVar26,auVar60);
          auVar55 = vcmpps_avx(auVar55,auVar62,1);
          local_1380 = vblendvps_avx(ZEXT1632(auVar53),ZEXT1632(auVar65),auVar55);
          auVar53 = vfmsub213ps_fma(local_15c0,local_1160,auVar24);
          auVar65 = vfmsub213ps_fma(auVar57,local_11a0,auVar27);
          auVar55 = vandps_avx(auVar24,auVar60);
          auVar62 = vandps_avx(auVar27,auVar60);
          auVar62 = vcmpps_avx(auVar55,auVar62,1);
          local_1360 = vblendvps_avx(ZEXT1632(auVar65),ZEXT1632(auVar53),auVar62);
          auVar53 = vpackssdw_avx(auVar56._0_16_,auVar56._16_16_);
          fVar99 = local_1360._0_4_;
          auVar61._0_4_ = fVar99 * local_1140;
          fVar85 = local_1360._4_4_;
          auVar61._4_4_ = fVar85 * local_1140;
          fVar86 = local_1360._8_4_;
          auVar61._8_4_ = fVar86 * local_1140;
          fVar87 = local_1360._12_4_;
          auVar61._12_4_ = fVar87 * local_1140;
          fVar88 = local_1360._16_4_;
          auVar61._16_4_ = fVar88 * local_1140;
          fVar89 = local_1360._20_4_;
          auVar61._20_4_ = fVar89 * local_1140;
          fVar90 = local_1360._24_4_;
          auVar61._24_4_ = fVar90 * local_1140;
          auVar61._28_4_ = 0;
          auVar65 = vfmadd213ps_fma(auVar117,local_1380,auVar61);
          auVar65 = vfmadd213ps_fma(local_1120,local_13a0,ZEXT1632(auVar65));
          auVar62 = ZEXT1632(CONCAT412(auVar65._12_4_ + auVar65._12_4_,
                                       CONCAT48(auVar65._8_4_ + auVar65._8_4_,
                                                CONCAT44(auVar65._4_4_ + auVar65._4_4_,
                                                         auVar65._0_4_ + auVar65._0_4_))));
          auVar29._4_4_ = fVar85 * fVar112;
          auVar29._0_4_ = fVar99 * fVar110;
          auVar29._8_4_ = fVar86 * fVar113;
          auVar29._12_4_ = fVar87 * fVar114;
          auVar29._16_4_ = fVar88 * fVar115;
          auVar29._20_4_ = fVar89 * fVar118;
          auVar29._24_4_ = fVar90 * fVar119;
          auVar29._28_4_ = auVar55._28_4_;
          auVar65 = vfmadd213ps_fma(local_1580,local_1380,auVar29);
          auVar66 = vfmadd213ps_fma(local_1560,local_13a0,ZEXT1632(auVar65));
          auVar55 = vrcpps_avx(auVar62);
          auVar111._8_4_ = 0x3f800000;
          auVar111._0_8_ = &DAT_3f8000003f800000;
          auVar111._12_4_ = 0x3f800000;
          auVar111._16_4_ = 0x3f800000;
          auVar111._20_4_ = 0x3f800000;
          auVar111._24_4_ = 0x3f800000;
          auVar111._28_4_ = 0x3f800000;
          auVar65 = vfnmadd213ps_fma(auVar55,auVar62,auVar111);
          auVar65 = vfmadd132ps_fma(ZEXT1632(auVar65),auVar55,auVar55);
          local_12e0._28_4_ = 0x3f800000;
          local_12e0._0_28_ =
               ZEXT1628(CONCAT412(auVar65._12_4_ * (auVar66._12_4_ + auVar66._12_4_),
                                  CONCAT48(auVar65._8_4_ * (auVar66._8_4_ + auVar66._8_4_),
                                           CONCAT44(auVar65._4_4_ * (auVar66._4_4_ + auVar66._4_4_),
                                                    auVar65._0_4_ * (auVar66._0_4_ + auVar66._0_4_))
                                          )));
          auVar52 = ZEXT3264(local_12e0);
          uVar46 = *(undefined4 *)(ray + k * 4 + 0x60);
          auVar80._4_4_ = uVar46;
          auVar80._0_4_ = uVar46;
          auVar80._8_4_ = uVar46;
          auVar80._12_4_ = uVar46;
          auVar80._16_4_ = uVar46;
          auVar80._20_4_ = uVar46;
          auVar80._24_4_ = uVar46;
          auVar80._28_4_ = uVar46;
          uVar46 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar97._4_4_ = uVar46;
          auVar97._0_4_ = uVar46;
          auVar97._8_4_ = uVar46;
          auVar97._12_4_ = uVar46;
          auVar97._16_4_ = uVar46;
          auVar97._20_4_ = uVar46;
          auVar97._24_4_ = uVar46;
          auVar97._28_4_ = uVar46;
          auVar55 = vcmpps_avx(auVar80,local_12e0,2);
          auVar56 = vcmpps_avx(local_12e0,auVar97,2);
          auVar55 = vandps_avx(auVar56,auVar55);
          auVar65 = vpackssdw_avx(auVar55._0_16_,auVar55._16_16_);
          auVar53 = vpand_avx(auVar65,auVar53);
          auVar55 = vpmovsxwd_avx2(auVar53);
          if ((((((((auVar55 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar55 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar55 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar55 >> 0x7f,0) != '\0') ||
                (auVar55 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar55 >> 0xbf,0) != '\0') ||
              (auVar55 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar55[0x1f] < '\0') {
            auVar55 = vcmpps_avx(auVar62,_DAT_02020f00,4);
            auVar65 = vpackssdw_avx(auVar55._0_16_,auVar55._16_16_);
            auVar53 = vpand_avx(auVar53,auVar65);
            local_1540 = vpmovsxwd_avx2(auVar53);
            if ((((((((local_1540 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (local_1540 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (local_1540 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(local_1540 >> 0x7f,0) != '\0') ||
                  (local_1540 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(local_1540 >> 0xbf,0) != '\0') ||
                (local_1540 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                local_1540[0x1f] < '\0') {
              uStack_13f0 = 0;
              uStack_13ec = 0;
              uStack_13e8 = 0;
              uStack_13e4 = 0;
              local_1340 = local_1540;
              local_1260 = local_1200;
              pSVar3 = context->scene;
              auVar55 = vrcpps_avx(local_13c0);
              auVar102._8_4_ = 0x3f800000;
              auVar102._0_8_ = &DAT_3f8000003f800000;
              auVar102._12_4_ = 0x3f800000;
              auVar102._16_4_ = 0x3f800000;
              auVar102._20_4_ = 0x3f800000;
              auVar102._24_4_ = 0x3f800000;
              auVar102._28_4_ = 0x3f800000;
              auVar65 = vfnmadd213ps_fma(local_13c0,auVar55,auVar102);
              auVar65 = vfmadd132ps_fma(ZEXT1632(auVar65),auVar55,auVar55);
              auVar81._8_4_ = 0x219392ef;
              auVar81._0_8_ = 0x219392ef219392ef;
              auVar81._12_4_ = 0x219392ef;
              auVar81._16_4_ = 0x219392ef;
              auVar81._20_4_ = 0x219392ef;
              auVar81._24_4_ = 0x219392ef;
              auVar81._28_4_ = 0x219392ef;
              auVar55 = vcmpps_avx(local_11e0,auVar81,5);
              auVar55 = vandps_avx(auVar55,ZEXT1632(auVar65));
              auVar30._4_4_ = local_1400._4_4_ * auVar55._4_4_;
              auVar30._0_4_ = local_1400._0_4_ * auVar55._0_4_;
              auVar30._8_4_ = local_1400._8_4_ * auVar55._8_4_;
              auVar30._12_4_ = local_1400._12_4_ * auVar55._12_4_;
              auVar30._16_4_ = auVar55._16_4_ * 0.0;
              auVar30._20_4_ = auVar55._20_4_ * 0.0;
              auVar30._24_4_ = auVar55._24_4_ * 0.0;
              auVar30._28_4_ = 0;
              auVar56 = vminps_avx(auVar30,auVar102);
              auVar31._4_4_ = auVar54._4_4_ * auVar55._4_4_;
              auVar31._0_4_ = auVar54._0_4_ * auVar55._0_4_;
              auVar31._8_4_ = auVar54._8_4_ * auVar55._8_4_;
              auVar31._12_4_ = auVar54._12_4_ * auVar55._12_4_;
              auVar31._16_4_ = auVar55._16_4_ * 0.0;
              auVar31._20_4_ = auVar55._20_4_ * 0.0;
              auVar31._24_4_ = auVar55._24_4_ * 0.0;
              auVar31._28_4_ = local_1180._28_4_;
              auVar55 = vminps_avx(auVar31,auVar102);
              auVar62 = vsubps_avx(auVar102,auVar56);
              auVar11 = vsubps_avx(auVar102,auVar55);
              local_1300 = vblendvps_avx(auVar55,auVar62,local_1200);
              local_1320 = vblendvps_avx(auVar56,auVar11,local_1200);
              local_12c0[0] = local_13a0._0_4_ * (float)local_1220._0_4_;
              local_12c0[1] = local_13a0._4_4_ * (float)local_1220._4_4_;
              local_12c0[2] = local_13a0._8_4_ * fStack_1218;
              local_12c0[3] = local_13a0._12_4_ * fStack_1214;
              fStack_12b0 = local_13a0._16_4_ * fStack_1210;
              fStack_12ac = local_13a0._20_4_ * fStack_120c;
              fStack_12a8 = local_13a0._24_4_ * fStack_1208;
              uStack_12a4 = local_1320._28_4_;
              local_12a0[0] = (float)local_1220._0_4_ * local_1380._0_4_;
              local_12a0[1] = (float)local_1220._4_4_ * local_1380._4_4_;
              local_12a0[2] = fStack_1218 * local_1380._8_4_;
              local_12a0[3] = fStack_1214 * local_1380._12_4_;
              fStack_1290 = fStack_1210 * local_1380._16_4_;
              fStack_128c = fStack_120c * local_1380._20_4_;
              fStack_1288 = fStack_1208 * local_1380._24_4_;
              uStack_1284 = local_1300._28_4_;
              local_1280[0] = (float)local_1220._0_4_ * fVar99;
              local_1280[1] = (float)local_1220._4_4_ * fVar85;
              local_1280[2] = fStack_1218 * fVar86;
              local_1280[3] = fStack_1214 * fVar87;
              fStack_1270 = fStack_1210 * fVar88;
              fStack_126c = fStack_120c * fVar89;
              fStack_1268 = fStack_1208 * fVar90;
              uStack_1264 = uStack_1204;
              auVar55 = vpmovsxwd_avx2(auVar53);
              auVar70._8_4_ = 0x7f800000;
              auVar70._0_8_ = 0x7f8000007f800000;
              auVar70._12_4_ = 0x7f800000;
              auVar70._16_4_ = 0x7f800000;
              auVar70._20_4_ = 0x7f800000;
              auVar70._24_4_ = 0x7f800000;
              auVar70._28_4_ = 0x7f800000;
              auVar55 = vblendvps_avx(auVar70,local_12e0,auVar55);
              auVar56 = vshufps_avx(auVar55,auVar55,0xb1);
              auVar56 = vminps_avx(auVar55,auVar56);
              auVar62 = vshufpd_avx(auVar56,auVar56,5);
              auVar56 = vminps_avx(auVar56,auVar62);
              auVar62 = vpermpd_avx2(auVar56,0x4e);
              auVar56 = vminps_avx(auVar56,auVar62);
              auVar55 = vcmpps_avx(auVar55,auVar56,0);
              auVar54 = vpackssdw_avx(auVar55._0_16_,auVar55._16_16_);
              auVar54 = vpand_avx(auVar54,auVar53);
              auVar55 = vpmovsxwd_avx2(auVar54);
              if ((((((((auVar55 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar55 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar55 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar55 >> 0x7f,0) == '\0') &&
                    (auVar55 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar55 >> 0xbf,0) == '\0') &&
                  (auVar55 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar55[0x1f]) {
                auVar55 = local_1540;
              }
              uVar36 = vmovmskps_avx(auVar55);
              uVar37 = 0;
              for (; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x80000000) {
                uVar37 = uVar37 + 1;
              }
              do {
                uVar47 = (ulong)uVar37;
                uVar37 = *(uint *)((long)&local_10e0 + uVar47 * 4);
                pGVar4 = (pSVar3->geometries).items[uVar37].ptr;
                if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                  *(undefined4 *)(local_1540 + uVar47 * 4) = 0;
                }
                else {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    uVar46 = *(undefined4 *)(local_1320 + uVar47 * 4);
                    uVar2 = *(undefined4 *)(local_1300 + uVar47 * 4);
                    *(float *)(ray + k * 4 + 0x100) = local_12c0[uVar47 - 8];
                    *(float *)(ray + k * 4 + 0x180) = local_12c0[uVar47];
                    *(float *)(ray + k * 4 + 0x1a0) = local_12a0[uVar47];
                    *(float *)(ray + k * 4 + 0x1c0) = local_1280[uVar47];
                    *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar46;
                    *(undefined4 *)(ray + k * 4 + 0x200) = uVar2;
                    *(undefined4 *)(ray + k * 4 + 0x220) =
                         *(undefined4 *)((long)&local_1420 + uVar47 * 4);
                    *(uint *)(ray + k * 4 + 0x240) = uVar37;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                    break;
                  }
                  local_1060 = *(undefined4 *)(local_1320 + uVar47 * 4);
                  local_1040 = *(undefined4 *)(local_1300 + uVar47 * 4);
                  local_1020 = *(undefined4 *)((long)&local_1420 + uVar47 * 4);
                  fVar110 = local_12c0[uVar47];
                  fVar112 = local_12a0[uVar47];
                  local_10a0._4_4_ = fVar112;
                  local_10a0._0_4_ = fVar112;
                  local_10a0._8_4_ = fVar112;
                  local_10a0._12_4_ = fVar112;
                  local_10a0._16_4_ = fVar112;
                  local_10a0._20_4_ = fVar112;
                  local_10a0._24_4_ = fVar112;
                  local_10a0._28_4_ = fVar112;
                  fVar112 = local_1280[uVar47];
                  local_1080._4_4_ = fVar112;
                  local_1080._0_4_ = fVar112;
                  local_1080._8_4_ = fVar112;
                  local_1080._12_4_ = fVar112;
                  local_1080._16_4_ = fVar112;
                  local_1080._20_4_ = fVar112;
                  local_1080._24_4_ = fVar112;
                  local_1080._28_4_ = fVar112;
                  local_1000._4_4_ = uVar37;
                  local_1000._0_4_ = uVar37;
                  local_1000._8_4_ = uVar37;
                  local_1000._12_4_ = uVar37;
                  local_1000._16_4_ = uVar37;
                  local_1000._20_4_ = uVar37;
                  local_1000._24_4_ = uVar37;
                  local_1000._28_4_ = uVar37;
                  local_10c0[0] = (RTCHitN)SUB41(fVar110,0);
                  local_10c0[1] = (RTCHitN)(char)((uint)fVar110 >> 8);
                  local_10c0[2] = (RTCHitN)(char)((uint)fVar110 >> 0x10);
                  local_10c0[3] = (RTCHitN)(char)((uint)fVar110 >> 0x18);
                  local_10c0[4] = (RTCHitN)SUB41(fVar110,0);
                  local_10c0[5] = (RTCHitN)(char)((uint)fVar110 >> 8);
                  local_10c0[6] = (RTCHitN)(char)((uint)fVar110 >> 0x10);
                  local_10c0[7] = (RTCHitN)(char)((uint)fVar110 >> 0x18);
                  local_10c0[8] = (RTCHitN)SUB41(fVar110,0);
                  local_10c0[9] = (RTCHitN)(char)((uint)fVar110 >> 8);
                  local_10c0[10] = (RTCHitN)(char)((uint)fVar110 >> 0x10);
                  local_10c0[0xb] = (RTCHitN)(char)((uint)fVar110 >> 0x18);
                  local_10c0[0xc] = (RTCHitN)SUB41(fVar110,0);
                  local_10c0[0xd] = (RTCHitN)(char)((uint)fVar110 >> 8);
                  local_10c0[0xe] = (RTCHitN)(char)((uint)fVar110 >> 0x10);
                  local_10c0[0xf] = (RTCHitN)(char)((uint)fVar110 >> 0x18);
                  local_10c0[0x10] = (RTCHitN)SUB41(fVar110,0);
                  local_10c0[0x11] = (RTCHitN)(char)((uint)fVar110 >> 8);
                  local_10c0[0x12] = (RTCHitN)(char)((uint)fVar110 >> 0x10);
                  local_10c0[0x13] = (RTCHitN)(char)((uint)fVar110 >> 0x18);
                  local_10c0[0x14] = (RTCHitN)SUB41(fVar110,0);
                  local_10c0[0x15] = (RTCHitN)(char)((uint)fVar110 >> 8);
                  local_10c0[0x16] = (RTCHitN)(char)((uint)fVar110 >> 0x10);
                  local_10c0[0x17] = (RTCHitN)(char)((uint)fVar110 >> 0x18);
                  local_10c0[0x18] = (RTCHitN)SUB41(fVar110,0);
                  local_10c0[0x19] = (RTCHitN)(char)((uint)fVar110 >> 8);
                  local_10c0[0x1a] = (RTCHitN)(char)((uint)fVar110 >> 0x10);
                  local_10c0[0x1b] = (RTCHitN)(char)((uint)fVar110 >> 0x18);
                  local_10c0[0x1c] = (RTCHitN)SUB41(fVar110,0);
                  local_10c0[0x1d] = (RTCHitN)(char)((uint)fVar110 >> 8);
                  local_10c0[0x1e] = (RTCHitN)(char)((uint)fVar110 >> 0x10);
                  local_10c0[0x1f] = (RTCHitN)(char)((uint)fVar110 >> 0x18);
                  uStack_105c = local_1060;
                  uStack_1058 = local_1060;
                  uStack_1054 = local_1060;
                  uStack_1050 = local_1060;
                  uStack_104c = local_1060;
                  uStack_1048 = local_1060;
                  uStack_1044 = local_1060;
                  uStack_103c = local_1040;
                  uStack_1038 = local_1040;
                  uStack_1034 = local_1040;
                  uStack_1030 = local_1040;
                  uStack_102c = local_1040;
                  uStack_1028 = local_1040;
                  uStack_1024 = local_1040;
                  uStack_101c = local_1020;
                  uStack_1018 = local_1020;
                  uStack_1014 = local_1020;
                  uStack_1010 = local_1020;
                  uStack_100c = local_1020;
                  uStack_1008 = local_1020;
                  uStack_1004 = local_1020;
                  auVar55 = vpcmpeqd_avx2(local_1000,local_1000);
                  uStack_fdc = context->user->instID[0];
                  local_fe0 = uStack_fdc;
                  uStack_fd8 = uStack_fdc;
                  uStack_fd4 = uStack_fdc;
                  uStack_fd0 = uStack_fdc;
                  uStack_fcc = uStack_fdc;
                  uStack_fc8 = uStack_fdc;
                  uStack_fc4 = uStack_fdc;
                  uStack_fbc = context->user->instPrimID[0];
                  local_fc0 = uStack_fbc;
                  uStack_fb8 = uStack_fbc;
                  uStack_fb4 = uStack_fbc;
                  uStack_fb0 = uStack_fbc;
                  uStack_fac = uStack_fbc;
                  uStack_fa8 = uStack_fbc;
                  uStack_fa4 = uStack_fbc;
                  uVar46 = *(undefined4 *)(ray + k * 4 + 0x100);
                  *(float *)(ray + k * 4 + 0x100) = local_12c0[uVar47 - 8];
                  local_14e0 = local_1240._0_8_;
                  uStack_14d8 = local_1240._8_8_;
                  uStack_14d0 = local_1240._16_8_;
                  uStack_14c8 = local_1240._24_8_;
                  local_15f0.valid = (int *)&local_14e0;
                  local_15f0.geometryUserPtr = pGVar4->userPtr;
                  local_15f0.context = context->user;
                  local_15f0.hit = local_10c0;
                  local_15f0.N = 8;
                  local_15f0.ray = (RTCRayN *)ray;
                  if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    local_1580._0_8_ = lVar42;
                    local_1500._0_8_ = pauVar45;
                    local_1560._0_8_ = lVar39;
                    local_15a0 = auVar52._0_32_;
                    local_15c0._0_4_ = uVar46;
                    auVar55 = ZEXT1632(auVar55._0_16_);
                    (*pGVar4->intersectionFilterN)(&local_15f0);
                    auVar52 = ZEXT3264(local_15a0);
                    auVar55 = vpcmpeqd_avx2(auVar55,auVar55);
                    lVar39 = local_1560._0_8_;
                    lVar42 = local_1580._0_8_;
                    pauVar45 = (undefined1 (*) [16])local_1500._0_8_;
                    uVar46 = local_15c0._0_4_;
                  }
                  auVar32._8_8_ = uStack_14d8;
                  auVar32._0_8_ = local_14e0;
                  auVar32._16_8_ = uStack_14d0;
                  auVar32._24_8_ = uStack_14c8;
                  auVar62 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar32);
                  auVar56 = auVar55 & ~auVar62;
                  if ((((((((auVar56 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar56 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar56 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar56 >> 0x7f,0) == '\0') &&
                        (auVar56 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar56 >> 0xbf,0) == '\0') &&
                      (auVar56 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar56[0x1f]) {
                    auVar62 = auVar62 ^ auVar55;
                  }
                  else {
                    p_Var5 = context->args->filter;
                    if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                      local_1580._0_8_ = lVar42;
                      local_1560._0_8_ = lVar39;
                      local_15a0 = auVar52._0_32_;
                      local_15c0._0_4_ = uVar46;
                      auVar55 = ZEXT1632(auVar55._0_16_);
                      (*p_Var5)(&local_15f0);
                      auVar52 = ZEXT3264(local_15a0);
                      auVar55 = vpcmpeqd_avx2(auVar55,auVar55);
                      lVar39 = local_1560._0_8_;
                      lVar42 = local_1580._0_8_;
                      uVar46 = local_15c0._0_4_;
                    }
                    auVar33._8_8_ = uStack_14d8;
                    auVar33._0_8_ = local_14e0;
                    auVar33._16_8_ = uStack_14d0;
                    auVar33._24_8_ = uStack_14c8;
                    auVar11 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar33);
                    auVar62 = auVar11 ^ auVar55;
                    auVar56 = auVar55 & ~auVar11;
                    if ((((((((auVar56 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar56 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar56 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar56 >> 0x7f,0) != '\0') ||
                          (auVar56 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar56 >> 0xbf,0) != '\0') ||
                        (auVar56 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar56[0x1f] < '\0') {
                      auVar64._0_4_ = auVar11._0_4_ ^ auVar55._0_4_;
                      auVar64._4_4_ = auVar11._4_4_ ^ auVar55._4_4_;
                      auVar64._8_4_ = auVar11._8_4_ ^ auVar55._8_4_;
                      auVar64._12_4_ = auVar11._12_4_ ^ auVar55._12_4_;
                      auVar64._16_4_ = auVar11._16_4_ ^ auVar55._16_4_;
                      auVar64._20_4_ = auVar11._20_4_ ^ auVar55._20_4_;
                      auVar64._24_4_ = auVar11._24_4_ ^ auVar55._24_4_;
                      auVar64._28_4_ = auVar11._28_4_ ^ auVar55._28_4_;
                      auVar55 = vmaskmovps_avx(auVar64,*(undefined1 (*) [32])local_15f0.hit);
                      *(undefined1 (*) [32])(local_15f0.ray + 0x180) = auVar55;
                      auVar55 = vmaskmovps_avx(auVar64,*(undefined1 (*) [32])(local_15f0.hit + 0x20)
                                              );
                      *(undefined1 (*) [32])(local_15f0.ray + 0x1a0) = auVar55;
                      auVar55 = vmaskmovps_avx(auVar64,*(undefined1 (*) [32])(local_15f0.hit + 0x40)
                                              );
                      *(undefined1 (*) [32])(local_15f0.ray + 0x1c0) = auVar55;
                      auVar55 = vmaskmovps_avx(auVar64,*(undefined1 (*) [32])(local_15f0.hit + 0x60)
                                              );
                      *(undefined1 (*) [32])(local_15f0.ray + 0x1e0) = auVar55;
                      auVar55 = vmaskmovps_avx(auVar64,*(undefined1 (*) [32])(local_15f0.hit + 0x80)
                                              );
                      *(undefined1 (*) [32])(local_15f0.ray + 0x200) = auVar55;
                      auVar55 = vpmaskmovd_avx2(auVar64,*(undefined1 (*) [32])
                                                         (local_15f0.hit + 0xa0));
                      *(undefined1 (*) [32])(local_15f0.ray + 0x220) = auVar55;
                      auVar55 = vpmaskmovd_avx2(auVar64,*(undefined1 (*) [32])
                                                         (local_15f0.hit + 0xc0));
                      *(undefined1 (*) [32])(local_15f0.ray + 0x240) = auVar55;
                      auVar55 = vpmaskmovd_avx2(auVar64,*(undefined1 (*) [32])
                                                         (local_15f0.hit + 0xe0));
                      *(undefined1 (*) [32])(local_15f0.ray + 0x260) = auVar55;
                      auVar55 = vpmaskmovd_avx2(auVar64,*(undefined1 (*) [32])
                                                         (local_15f0.hit + 0x100));
                      *(undefined1 (*) [32])(local_15f0.ray + 0x280) = auVar55;
                    }
                  }
                  if ((((((((auVar62 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar62 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar62 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar62 >> 0x7f,0) == '\0') &&
                        (auVar62 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar62 >> 0xbf,0) == '\0') &&
                      (auVar62 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar62[0x1f]) {
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar46;
                  }
                  *(undefined4 *)(local_1540 + uVar47 * 4) = 0;
                  uVar46 = *(undefined4 *)(ray + k * 4 + 0x100);
                  auVar51._4_4_ = uVar46;
                  auVar51._0_4_ = uVar46;
                  auVar51._8_4_ = uVar46;
                  auVar51._12_4_ = uVar46;
                  auVar51._16_4_ = uVar46;
                  auVar51._20_4_ = uVar46;
                  auVar51._24_4_ = uVar46;
                  auVar51._28_4_ = uVar46;
                  auVar55 = vcmpps_avx(auVar52._0_32_,auVar51,2);
                  local_1540 = vandps_avx(auVar55,local_1540);
                }
                if ((((((((local_1540 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (local_1540 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_1540 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(local_1540 >> 0x7f,0) == '\0') &&
                      (local_1540 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(local_1540 >> 0xbf,0) == '\0') &&
                    (local_1540 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < local_1540[0x1f]) break;
                auVar63._8_4_ = 0x7f800000;
                auVar63._0_8_ = 0x7f8000007f800000;
                auVar63._12_4_ = 0x7f800000;
                auVar63._16_4_ = 0x7f800000;
                auVar63._20_4_ = 0x7f800000;
                auVar63._24_4_ = 0x7f800000;
                auVar63._28_4_ = 0x7f800000;
                auVar55 = vblendvps_avx(auVar63,auVar52._0_32_,local_1540);
                auVar56 = vshufps_avx(auVar55,auVar55,0xb1);
                auVar56 = vminps_avx(auVar55,auVar56);
                auVar62 = vshufpd_avx(auVar56,auVar56,5);
                auVar56 = vminps_avx(auVar56,auVar62);
                auVar62 = vpermpd_avx2(auVar56,0x4e);
                auVar56 = vminps_avx(auVar56,auVar62);
                auVar56 = vcmpps_avx(auVar55,auVar56,0);
                auVar62 = local_1540 & auVar56;
                auVar55 = local_1540;
                if ((((((((auVar62 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar62 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar62 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar62 >> 0x7f,0) != '\0') ||
                      (auVar62 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar62 >> 0xbf,0) != '\0') ||
                    (auVar62 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar62[0x1f] < '\0') {
                  auVar55 = vandps_avx(auVar56,local_1540);
                }
                uVar36 = vmovmskps_avx(auVar55);
                uVar37 = 0;
                for (; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x80000000) {
                  uVar37 = uVar37 + 1;
                }
              } while( true );
            }
          }
        }
        lVar42 = lVar42 + 1;
      } while (lVar42 != lVar39);
    }
    uVar46 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar52 = ZEXT1664(CONCAT412(uVar46,CONCAT48(uVar46,CONCAT44(uVar46,uVar46))));
    auVar96 = ZEXT1664(local_1430);
    auVar98 = ZEXT1664(local_1440);
    auVar103 = ZEXT1664(local_1450);
    auVar92 = ZEXT1664(local_1510);
    fVar110 = local_1460;
    fVar112 = fStack_145c;
    fVar113 = fStack_1458;
    fVar114 = fStack_1454;
    fVar115 = local_1470;
    fVar118 = fStack_146c;
    fVar119 = fStack_1468;
    fVar99 = fStack_1464;
    fVar85 = local_1480;
    fVar86 = fStack_147c;
    fVar87 = fStack_1478;
    fVar88 = fStack_1474;
    fVar89 = local_1490;
    fVar90 = fStack_148c;
    fVar121 = fStack_1488;
    fVar122 = fStack_1484;
    fVar123 = local_14a0;
    fVar125 = fStack_149c;
    fVar126 = fStack_1498;
    fVar127 = fStack_1494;
    fVar128 = local_14b0;
    fVar130 = fStack_14ac;
    fVar131 = fStack_14a8;
    fVar132 = fStack_14a4;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }